

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

Gia_Man_t * Gia_ManFromBridgeReadBody(int Size,uchar *pBuffer,Vec_Int_t **pvInits)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Vec_Int_t *p_01;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  byte *pbVar27;
  
  bVar12 = 0;
  bVar11 = 0;
  uVar17 = 0;
  bVar13 = *pBuffer;
  pbVar21 = pBuffer + 1;
  while ((char)bVar13 < '\0') {
    uVar17 = uVar17 | (bVar13 & 0x7f) << (bVar11 & 0x1f);
    bVar11 = bVar11 + 7;
    bVar13 = *pbVar21;
    pbVar21 = pbVar21 + 1;
  }
  uVar4 = (uint)*pbVar21;
  pbVar20 = pbVar21 + 1;
  if ((char)*pbVar21 < '\0') {
    bVar12 = 0;
    uVar24 = 0;
    do {
      uVar24 = uVar24 | (uVar4 & 0x7f) << (bVar12 & 0x1f);
      bVar1 = *pbVar20;
      uVar4 = (uint)bVar1;
      pbVar20 = pbVar20 + 1;
      bVar12 = bVar12 + 7;
    } while ((char)bVar1 < '\0');
  }
  else {
    uVar24 = 0;
  }
  uVar17 = (uint)bVar13 << (bVar11 & 0x1f) | uVar17;
  uVar24 = uVar4 << (bVar12 & 0x1f) | uVar24;
  uVar4 = (uint)*pbVar20;
  pbVar21 = pbVar20 + 1;
  bVar13 = 0;
  if ((char)*pbVar20 < '\0') {
    bVar13 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 | (uVar4 & 0x7f) << (bVar13 & 0x1f);
      bVar12 = *pbVar21;
      uVar4 = (uint)bVar12;
      pbVar21 = pbVar21 + 1;
      bVar13 = bVar13 + 7;
    } while ((char)bVar12 < '\0');
  }
  else {
    uVar3 = 0;
  }
  uVar3 = uVar4 << (bVar13 & 0x1f) | uVar3;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p->pArray = piVar6;
  Vec_IntPush(p,-999);
  Vec_IntPush(p,1);
  p_00 = Gia_ManStart(uVar17 + uVar24 * 2 + uVar3 + 2);
  pcVar7 = (char *)malloc(5);
  builtin_strncpy(pcVar7,"temp",5);
  p_00->pName = pcVar7;
  if (0 < (int)uVar17) {
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001cc8d3;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001cc8d3;
      Vec_IntPush(p,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556);
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  uVar17 = uVar24;
  if (0 < (int)uVar24) {
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001cc8d3;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_001cc8d3;
      Vec_IntPush(p,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556);
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  if (0 < (int)uVar3) {
    uVar17 = 0;
    do {
      bVar13 = *pbVar21;
      bVar12 = 0;
      uVar4 = 0;
      while( true ) {
        pbVar20 = pbVar21 + 1;
        if (-1 < (char)bVar13) break;
        uVar4 = uVar4 | (bVar13 & 0x7f) << (bVar12 & 0x1f);
        bVar13 = *pbVar20;
        bVar12 = bVar12 + 7;
        pbVar21 = pbVar20;
      }
      uVar18 = (uint)*pbVar20;
      pbVar21 = pbVar21 + 2;
      bVar11 = 0;
      if ((char)*pbVar20 < '\0') {
        bVar11 = 0;
        uVar25 = 0;
        do {
          uVar25 = uVar25 | (uVar18 & 0x7f) << (bVar11 & 0x1f);
          bVar1 = *pbVar21;
          uVar18 = (uint)bVar1;
          pbVar21 = pbVar21 + 1;
          bVar11 = bVar11 + 7;
        } while ((char)bVar1 < '\0');
      }
      else {
        uVar25 = 0;
      }
      uVar4 = (uint)bVar13 << (bVar12 & 0x1f) | uVar4;
      if ((uVar4 & 1) != 0) {
        __assert_fail("!(iFan0 & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x15c,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      if (p->nSize <= (int)(uVar4 >> 2)) goto LAB_001cc911;
      uVar26 = p->pArray[uVar4 >> 2];
      if ((int)uVar26 < 0) goto LAB_001cc8f2;
      uVar25 = uVar18 << (bVar11 & 0x1f) | uVar25;
      uVar18 = uVar25 >> 1;
      if (p->nSize <= (int)uVar18) goto LAB_001cc911;
      uVar18 = p->pArray[uVar18];
      if ((int)uVar18 < 0) goto LAB_001cc8f2;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar14 = uVar26 >> 1;
      iVar2 = p_00->nObjs;
      if (iVar2 <= (int)uVar14) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar5 = uVar18 >> 1;
      if (iVar2 <= (int)uVar5) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if ((uVar14 == uVar5) && (p_00->fGiaSimple == 0)) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar26 = uVar26 ^ uVar4 >> 1 & 1;
      uVar18 = uVar18 ^ uVar25 & 1;
      iVar19 = (int)pGVar9;
      if ((int)uVar26 < (int)uVar18) {
        pGVar8 = p_00->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + iVar2 <= pGVar9)) goto LAB_001cc8d3;
        uVar10 = *(ulong *)pGVar9;
        uVar16 = (ulong)((uVar26 & 1) << 0x1d |
                        ((uint)(iVar19 - (int)pGVar8) >> 2) * -0x55555555 - uVar14 & 0x1fffffff);
        *(ulong *)pGVar9 = uVar16 | uVar10 & 0xffffffffc0000000;
        pGVar8 = p_00->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_001cc8d3;
        uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff) <<
                 0x20;
        *(ulong *)pGVar9 = uVar16 | uVar10 & 0xe0000000c0000000 | uVar15;
        uVar23 = (ulong)(uVar18 & 1) << 0x3d;
        uVar15 = uVar16 | uVar10 & 0xc0000000c0000000 | uVar15;
      }
      else {
        pGVar8 = p_00->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + iVar2 <= pGVar9)) {
LAB_001cc8d3:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar16 = (ulong)(((uint)(iVar19 - (int)pGVar8) >> 2) * -0x55555555 - uVar14 & 0x1fffffff) <<
                 0x20;
        uVar10 = *(ulong *)pGVar9;
        uVar22 = (ulong)(uVar26 & 1) << 0x3d;
        *(ulong *)pGVar9 = uVar22 | uVar10 & 0xc0000000ffffffff | uVar16;
        pGVar8 = p_00->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_001cc8d3;
        uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
        *(ulong *)pGVar9 = uVar22 | uVar10 & 0xc0000000e0000000 | uVar16 | uVar15;
        uVar23 = (ulong)((uVar18 & 1) << 0x1d);
        uVar15 = uVar22 | uVar10 & 0xc0000000c0000000 | uVar16 | uVar15;
      }
      *(ulong *)pGVar9 = uVar15 | uVar23;
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar9 + -(uVar15 & 0x1fffffff),pGVar9);
        Gia_ObjAddFanout(p_00,pGVar9 + -((ulong)*(uint *)&pGVar9->field_0x4 & 0x1fffffff),pGVar9);
      }
      if (p_00->fSweeper != 0) {
        uVar16 = *(ulong *)pGVar9 & 0x1fffffff;
        uVar10 = *(ulong *)pGVar9 >> 0x20 & 0x1fffffff;
        uVar22 = 0x4000000000000000;
        if (((uint)*(ulong *)(pGVar9 + -uVar16) >> 0x1e & 1) == 0) {
          uVar22 = 0x40000000;
        }
        *(ulong *)(pGVar9 + -uVar16) = uVar22 | *(ulong *)(pGVar9 + -uVar16);
        uVar22 = *(ulong *)(pGVar9 + -uVar10);
        uVar15 = 0x4000000000000000;
        if (((uint)uVar22 >> 0x1e & 1) == 0) {
          uVar15 = 0x40000000;
        }
        *(ulong *)(pGVar9 + -uVar10) = uVar15 | uVar22;
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 =
             uVar10 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar10 >> 0x3d) ^ (uint)(uVar22 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pGVar9 + -uVar16) >> 0x3f) ^
                    (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
      }
      if (p_00->fBuiltInSim != 0) {
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 =
             uVar10 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar10 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pGVar9 + -(uVar10 >> 0x20 & 0x1fffffff)) >> 0x3f)
                     ) & ((uint)((ulong)*(undefined8 *)(pGVar9 + -(uVar10 & 0x1fffffff)) >> 0x3f) ^
                         (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
        pGVar8 = p_00->pObjs;
        if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_001cc8d3;
        Gia_ManBuiltInSimPerform
                  (p_00,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
      }
      if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(p_00,pGVar9);
      }
      pGVar8 = p_00->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_001cc8d3;
      Vec_IntPush(p,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar3);
  }
  pbVar20 = pbVar21;
  if (0 < (int)uVar24) {
    uVar17 = 0;
    do {
      bVar13 = *pbVar20;
      while (pbVar20 = pbVar20 + 1, (char)bVar13 < '\0') {
        bVar13 = *pbVar20;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar24);
  }
  uVar17 = (uint)*pbVar20;
  pbVar27 = pbVar20 + 1;
  bVar13 = 0;
  if ((char)*pbVar20 < '\0') {
    bVar13 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | (uVar17 & 0x7f) << (bVar13 & 0x1f);
      bVar12 = *pbVar27;
      uVar17 = (uint)bVar12;
      pbVar27 = pbVar27 + 1;
      bVar13 = bVar13 + 7;
    } while ((char)bVar12 < '\0');
  }
  else {
    uVar4 = 0;
  }
  uVar4 = uVar17 << (bVar13 & 0x1f) | uVar4;
  if (0 < (int)uVar4) {
    iVar2 = p->nSize;
    uVar17 = 0;
    do {
      bVar13 = *pbVar27;
      bVar12 = 0;
      uVar3 = 0;
      while( true ) {
        pbVar27 = pbVar27 + 1;
        if (-1 < (char)bVar13) break;
        uVar3 = uVar3 | (bVar13 & 0x7f) << (bVar12 & 0x1f);
        bVar13 = *pbVar27;
        bVar12 = bVar12 + 7;
      }
      uVar3 = (uint)bVar13 << (bVar12 & 0x1f) | uVar3;
      uVar18 = uVar3 >> 1;
      if (iVar2 <= (int)uVar18) goto LAB_001cc911;
      if (p->pArray[uVar18] < 0) goto LAB_001cc8f2;
      Gia_ManAppendCo(p_00,uVar3 & 1 ^ p->pArray[uVar18] ^ 1);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar4);
  }
  uVar17 = (uint)*pbVar27;
  pbVar20 = pbVar27 + 1;
  bVar13 = 0;
  if ((char)*pbVar27 < '\0') {
    bVar13 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | (uVar17 & 0x7f) << (bVar13 & 0x1f);
      bVar12 = *pbVar20;
      uVar17 = (uint)bVar12;
      pbVar20 = pbVar20 + 1;
      bVar13 = bVar13 + 7;
    } while ((char)bVar12 < '\0');
  }
  else {
    uVar4 = 0;
  }
  if ((uVar17 << (bVar13 & 0x1f) | uVar4) != 1) {
    __assert_fail("verFairness == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17b,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar17 = (uint)*pbVar20;
  pbVar27 = pbVar20 + 1;
  bVar13 = 0;
  if ((char)*pbVar20 < '\0') {
    bVar13 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | (uVar17 & 0x7f) << (bVar13 & 0x1f);
      bVar12 = *pbVar27;
      uVar17 = (uint)bVar12;
      pbVar27 = pbVar27 + 1;
      bVar13 = bVar13 + 7;
    } while ((char)bVar12 < '\0');
  }
  else {
    uVar4 = 0;
  }
  if (uVar17 << (bVar13 & 0x1f) != 0 || uVar4 != 0) {
    __assert_fail("nFairness == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x17e,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  uVar17 = (uint)*pbVar27;
  pbVar20 = pbVar27 + 1;
  bVar13 = 0;
  if ((char)*pbVar27 < '\0') {
    bVar13 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | (uVar17 & 0x7f) << (bVar13 & 0x1f);
      bVar12 = *pbVar20;
      uVar17 = (uint)bVar12;
      pbVar20 = pbVar20 + 1;
      bVar13 = bVar13 + 7;
    } while ((char)bVar12 < '\0');
  }
  else {
    uVar4 = 0;
  }
  if (uVar17 << (bVar13 & 0x1f) != 0 || uVar4 != 0) {
    __assert_fail("nConstraints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x181,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  if (pBuffer + Size != pbVar20) {
    __assert_fail("pBufferEnd == pBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x184,"Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)")
    ;
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar17 = 0x10;
  if (0xe < uVar24 - 1) {
    uVar17 = uVar24;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar17;
  if (uVar17 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar17 << 2);
  }
  p_01->pArray = piVar6;
  if (0 < (int)uVar24) {
    uVar17 = 0;
    do {
      bVar13 = *pbVar21;
      bVar12 = 0;
      uVar4 = 0;
      while( true ) {
        pbVar21 = pbVar21 + 1;
        if (-1 < (char)bVar13) break;
        uVar4 = uVar4 | (bVar13 & 0x7f) << (bVar12 & 0x1f);
        bVar13 = *pbVar21;
        bVar12 = bVar12 + 7;
      }
      uVar4 = (uint)bVar13 << (bVar12 & 0x1f) | uVar4;
      if ((uVar4 & 3) != 2) {
        __assert_fail("(iFan0 & 3) == BRIDGE_VALUE_0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x18c,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      Vec_IntPush(p_01,2);
      if (p->nSize <= (int)(uVar4 >> 3)) {
LAB_001cc911:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[uVar4 >> 3] < 0) {
LAB_001cc8f2:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,p->pArray[uVar4 >> 3] ^ uVar4 >> 2 & 1);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar24);
  }
  Gia_ManSetRegNum(p_00,uVar24);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (pvInits == (Vec_Int_t **)0x0) {
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
  }
  else {
    *pvInits = p_01;
  }
  return p_00;
}

Assistant:

Gia_Man_t *  Gia_ManFromBridgeReadBody( int Size, unsigned char * pBuffer, Vec_Int_t ** pvInits )
{
    int fHash = 0;
    Vec_Int_t * vLits, * vInits;
    Gia_Man_t * p = NULL;
    unsigned char * pBufferPivot, * pBufferEnd = pBuffer + Size;
    int i, nInputs, nFlops, nGates, nProps;
    int verFairness, nFairness, nConstraints;
    unsigned iFan0, iFan1;

    nInputs = Gia_AigerReadUnsigned( &pBuffer );
    nFlops  = Gia_AigerReadUnsigned( &pBuffer );
    nGates  = Gia_AigerReadUnsigned( &pBuffer );

    vLits = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLits, -999 );
    Vec_IntPush( vLits,  1 );

    // start the AIG package
    p = Gia_ManStart( nInputs + nFlops * 2 + nGates + 1 + 1 ); // PI+FO+FI+AND+PO+1
    p->pName = Abc_UtilStrsav( "temp" );

    // create PIs
    for ( i = 0; i < nInputs; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create flop outputs
    for ( i = 0; i < nFlops; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create nodes
    if ( fHash )
        Gia_ManHashAlloc( p );
    for ( i = 0; i < nGates; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan1 = Gia_AigerReadUnsigned( &pBuffer );
        assert( !(iFan0 & 1) );
        iFan0 >>= 1;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        iFan1 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan1 >> 1), iFan1 & 1 );
        if ( fHash )
            Vec_IntPush( vLits, Gia_ManHashAnd(p, iFan0, iFan1) );
        else
            Vec_IntPush( vLits, Gia_ManAppendAnd(p, iFan0, iFan1) );

    }
    if ( fHash )
        Gia_ManHashStop( p );

    // remember where flops begin
    pBufferPivot = pBuffer;
    // scroll through flops
    for ( i = 0; i < nFlops; i++ )
        Gia_AigerReadUnsigned( &pBuffer );

    // create POs
    nProps = Gia_AigerReadUnsigned( &pBuffer );
//    assert( nProps == 1 );
    for ( i = 0; i < nProps; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        // complement property output!!!
        Gia_ManAppendCo( p, Abc_LitNot(iFan0) );
    }

    verFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( verFairness == 1 );

    nFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( nFairness == 0 );

    nConstraints = Gia_AigerReadUnsigned( &pBuffer );
    assert( nConstraints == 0);

    // make sure the end of buffer is reached
    assert( pBufferEnd == pBuffer );

    // resetting to flops
    pBuffer = pBufferPivot;
    vInits = Vec_IntAlloc( nFlops );
    for ( i = 0; i < nFlops; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        assert( (iFan0 & 3) == BRIDGE_VALUE_0 );
        Vec_IntPush( vInits, iFan0 & 3 ); // 0 = X value; 1 = not used; 2 = false; 3 = true
        iFan0 >>= 2;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        Gia_ManAppendCo( p, iFan0 );
    }
    Gia_ManSetRegNum( p, nFlops );
    Vec_IntFree( vLits );

    // remove wholes in the node list
    if ( fHash )
    {
        Gia_Man_t * pTemp;
        p = Gia_ManCleanup( pTemp = p );
        Gia_ManStop( pTemp );
    }

    // return
    if ( pvInits )
        *pvInits = vInits;
    else
        Vec_IntFree( vInits );
    return p;
}